

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_test_util.cc
# Opt level: O3

void ctemplate::StringToFile(string *s,string *filename)

{
  FILE *__s;
  size_t sVar1;
  bool bVar2;
  utimbuf timbuf;
  utimbuf local_30;
  
  __s = fopen((filename->_M_dataplus)._M_p,"wb");
  if (__s == (FILE *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x80,"fp");
    __assert_fail("fp",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_test_util.cc"
                  ,0x80,"void ctemplate::StringToFile(const string &, const string &)");
  }
  sVar1 = fwrite((s->_M_dataplus)._M_p,1,s->_M_string_length,__s);
  if (sVar1 == s->_M_string_length) {
    fclose(__s);
    bVar2 = (int)g_time_mutex == 0;
    g_time_mutex._0_4_ = (int)g_time_mutex + -1;
    if (bVar2) {
      g_time_mutex._0_4_ = 0;
      local_30.actime = mock_time;
      local_30.modtime = mock_time;
      mock_time = mock_time + 1;
      utime((filename->_M_dataplus)._M_p,&local_30);
      return;
    }
    __assert_fail("--mutex_ == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/mutex.h"
                  ,0xea,"void ctemplate::Mutex::Lock()");
  }
  printf("ASSERT FAILED, line %d: %s\n",0x82,"r == s.length()");
  if (sVar1 == s->_M_string_length) {
    exit(1);
  }
  __assert_fail("r == s.length()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_test_util.cc"
                ,0x82,"void ctemplate::StringToFile(const string &, const string &)");
}

Assistant:

void StringToFile(const string& s, const string& filename) {
  FILE* fp = fopen(filename.c_str(), "wb");
  ASSERT(fp);
  size_t r = fwrite(s.data(), 1, s.length(), fp);
  ASSERT(r == s.length());
  fclose(fp);

  g_time_mutex.Lock();
  const time_t file_time = mock_time++;
  g_time_mutex.Unlock();
  struct utimbuf timbuf = { file_time, file_time };
  utime(filename.c_str(), &timbuf);
}